

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_qemu_st_i64_tricore
               (TCGContext_conflict9 *tcg_ctx,TCGv_i64 val,TCGv_i32 addr,TCGArg idx,MemOp memop)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uint uVar2;
  uintptr_t o;
  
  uVar2 = memop << 4 & 0xffffff30;
  if ((memop & MO_64) != MO_8) {
    uVar2 = memop << 4;
  }
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_qemu_st_i64);
  pTVar1->args[0] = (TCGArg)(val + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(addr + (long)tcg_ctx);
  pTVar1->args[2] = (ulong)(uVar2 & 0xffffffb0 | (uint)idx);
  check_exit_request_tricore(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_st_i64(TCGContext *tcg_ctx, TCGv_i64 val, TCGv addr, TCGArg idx, MemOp memop)
{
    TCGv_i64 swap = NULL;

#if TCG_TARGET_REG_BITS == 32
    if ((memop & MO_SIZE) < MO_64) {
        tcg_gen_qemu_st_i32(tcg_ctx, TCGV_LOW(tcg_ctx, val), addr, idx, memop);
        check_exit_request(tcg_ctx);
        return;
    }
#endif

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_ST | TCG_MO_ST_ST);
    memop = tcg_canonicalize_memop(memop, 1, 1);

#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        swap = tcg_temp_new_i64(tcg_ctx);
        switch (memop & MO_SIZE) {
        case MO_16:
            tcg_gen_ext16u_i64(tcg_ctx, swap, val);
            tcg_gen_bswap16_i64(tcg_ctx, swap, swap);
            break;
        case MO_32:
            tcg_gen_ext32u_i64(tcg_ctx, swap, val);
            tcg_gen_bswap32_i64(tcg_ctx, swap, swap);
            break;
        case MO_64:
            tcg_gen_bswap64_i64(tcg_ctx, swap, val);
            break;
        default:
            g_assert_not_reached();
        }
        val = swap;
        memop &= ~MO_BSWAP;
    }
#endif

    gen_ldst_i64(tcg_ctx, INDEX_op_qemu_st_i64, val, addr, memop, idx);

    if (swap) {
        tcg_temp_free_i64(tcg_ctx, swap);
    }
    check_exit_request(tcg_ctx);
}